

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O3

int singlylinkedlist_remove(SINGLYLINKEDLIST_HANDLE list,LIST_ITEM_HANDLE item)

{
  LOGGER_LOG p_Var1;
  LIST_ITEM_HANDLE pLVar2;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  int iVar4;
  LIST_ITEM_HANDLE __ptr;
  
  if (item == (LIST_ITEM_HANDLE)0x0 || list == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x6e;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_remove",0x6d,1,"Invalid argument (list=%p, item=%p)",list,item);
    }
  }
  else {
    __ptr = list->head;
    iVar4 = 0x9a;
    if (__ptr != (LIST_ITEM_HANDLE)0x0) {
      if (__ptr == item) {
        pLVar2 = (LIST_ITEM_HANDLE)0x0;
      }
      else {
        do {
          pLVar2 = __ptr;
          __ptr = (LIST_ITEM_HANDLE)pLVar2->next;
          if (__ptr == (LIST_ITEM_HANDLE)0x0) {
            return 0x9a;
          }
        } while (__ptr != item);
      }
      pSVar3 = (SINGLYLINKEDLIST_HANDLE)&pLVar2->next;
      if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
        pSVar3 = list;
      }
      pSVar3->head = (LIST_ITEM_INSTANCE *)__ptr->next;
      if (list->tail == item) {
        list->tail = pLVar2;
      }
      free(__ptr);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int singlylinkedlist_remove(SINGLYLINKEDLIST_HANDLE list, LIST_ITEM_HANDLE item)
{
    int result;

    /* Codes_SRS_LIST_01_024: [If any of the arguments list or item_handle is NULL, singlylinkedlist_remove shall fail and return a non-zero value.] */
    if ((list == NULL) ||
        (item == NULL))
    {
        LogError("Invalid argument (list=%p, item=%p)", list, item);
        result = MU_FAILURE;
    }
    else
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;
        LIST_ITEM_INSTANCE* current_item = list_instance->head;
        LIST_ITEM_INSTANCE* previous_item = NULL;

        while (current_item != NULL)
        {
            if (current_item == item)
            {
                if (previous_item != NULL)
                {
                    previous_item->next = current_item->next;
                }
                else
                {
                    list_instance->head = (LIST_ITEM_INSTANCE*)current_item->next;
                }

                if (current_item == list_instance->tail)
                {
                    list_instance->tail = previous_item;
                }

                free(current_item);

                break;
            }

            previous_item = current_item;
            current_item = (LIST_ITEM_INSTANCE*)current_item->next;
        }

#ifdef _MSC_VER
#pragma warning(disable:6001) // Using uninitialized memory 'current_item'
#endif
        if (current_item == NULL)
#ifdef _MSC_VER
#pragma warning (default:6001)
#endif
        {
            /* Codes_SRS_LIST_01_025: [If the item item_handle is not found in the list, then singlylinkedlist_remove shall fail and return a non-zero value.] */
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_LIST_01_023: [singlylinkedlist_remove shall remove a list item from the list and on success it shall return 0.] */
            result = 0;
        }
    }

    return result;
}